

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O0

void __thiscall
jaegertracing::Span::
doLog<std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>>
          (Span *this,SystemTime timestamp,
          vector<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>,_std::allocator<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>_>_>
          *fieldPairs)

{
  bool bVar1;
  size_type __n;
  iterator iVar2;
  iterator iVar3;
  back_insert_iterator<std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_> bVar4;
  iterator first;
  iterator last;
  undefined1 local_48 [8];
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> fields;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  vector<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>,_std::allocator<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>_>_>
  *fieldPairs_local;
  Span *this_local;
  SystemTime timestamp_local;
  
  lock._M_device = (mutex_type *)fieldPairs;
  this_local = (Span *)timestamp.__d.__r;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->_mutex);
  bVar1 = SpanContext::isSampled(&this->_context);
  if (bVar1) {
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_48);
    __n = std::
          vector<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>,_std::allocator<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>_>_>
          ::size(fieldPairs);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::reserve
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_48,__n);
    iVar2 = std::
            begin<std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>>
                      (fieldPairs);
    iVar3 = std::
            end<std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>>
                      (fieldPairs);
    bVar4 = std::back_inserter<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>
                      ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_48);
    std::
    transform<__gnu_cxx::__normal_iterator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>*,std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>>,std::back_insert_iterator<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,jaegertracing::Span::doLog<std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>>(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>)::_lambda(std::pair<opentracing::v3::string_view,opentracing::v3::Value>const&)_1_>
              (iVar2._M_current,iVar3._M_current,bVar4.container);
    first = std::begin<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>
                      ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_48);
    last = std::end<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>
                     ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_48);
    logFieldsNoLocking<__gnu_cxx::__normal_iterator<jaegertracing::Tag*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
              (this,(time_point *)&this_local,
               (__normal_iterator<jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
                )first._M_current,
               (__normal_iterator<jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
                )last._M_current);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_48);
  }
  fields.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  fields.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void doLog(opentracing::SystemTime timestamp, Container fieldPairs) noexcept
    {
        std::lock_guard<std::mutex> lock(_mutex);
        if (!_context.isSampled()) {
            return;
        }

        std::vector<Tag> fields;
        fields.reserve(fieldPairs.size());
        std::transform(
            std::begin(fieldPairs),
            std::end(fieldPairs),
            std::back_inserter(fields),
            [](const std::pair<opentracing::string_view, opentracing::Value>&
                   pair) { return Tag(pair.first, pair.second); });
        logFieldsNoLocking(timestamp, std::begin(fields), std::end(fields));
    }